

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic-test.c++
# Opt level: O0

void __thiscall capnp::_::anon_unknown_0::TestCase458::run(TestCase458 *this)

{
  StringPtr name;
  initializer_list<capnp::DynamicValue::Reader> value;
  BuilderFor<capnp::schemas::TestEnum_9c8e9318b29d9cd3> BVar1;
  initializer_list<capnp::schemas::TestEnum_9c8e9318b29d9cd3> expected;
  Reader *local_388;
  undefined1 local_374 [20];
  StringPtr local_360;
  Builder local_350;
  ArrayPtr<const_char> local_310;
  Builder local_300;
  BuilderFor<capnp::schemas::TestEnum_9c8e9318b29d9cd3> local_2be;
  TestEnum_9c8e9318b29d9cd3 local_2bc;
  bool local_2b9;
  undefined1 auStack_2b8 [7];
  bool _kj_shouldLog;
  Builder local_2a8;
  TestEnum_9c8e9318b29d9cd3 local_264 [2];
  Reader *local_260;
  Reader local_258;
  Reader local_210;
  iterator local_1c8;
  undefined1 local_1c0 [30];
  TestEnum_9c8e9318b29d9cd3 local_1a2;
  Reader local_1a0;
  ArrayPtr<const_char> local_158 [2];
  Schema local_138;
  undefined1 local_130 [8];
  Builder root;
  MallocMessageBuilder builder;
  TestCase458 *this_local;
  
  MallocMessageBuilder::MallocMessageBuilder
            ((MallocMessageBuilder *)&root.builder.dataSize,0x400,GROW_HEURISTICALLY);
  local_138.raw = (RawBrandedSchema *)Schema::from<capnproto_test::capnp::test::TestAllTypes>();
  MessageBuilder::initRoot<capnp::DynamicStruct,capnp::StructSchema>
            ((Builder *)local_130,(MessageBuilder *)&root.builder.dataSize,
             (StructSchema)local_138.raw);
  kj::StringPtr::StringPtr((StringPtr *)local_158,"enumField");
  local_1a2 = BAZ;
  DynamicValue::Reader::Reader<capnp::schemas::TestEnum_9c8e9318b29d9cd3,capnp::DynamicEnum>
            (&local_1a0,&local_1a2);
  DynamicStruct::Builder::set((Builder *)local_130,(StringPtr)local_158[0],&local_1a0);
  DynamicValue::Reader::~Reader(&local_1a0);
  kj::StringPtr::StringPtr((StringPtr *)(local_1c0 + 8),"enumList");
  local_260 = &local_258;
  local_264[1] = 1;
  DynamicValue::Reader::Reader<capnp::schemas::TestEnum_9c8e9318b29d9cd3,capnp::DynamicEnum>
            (local_260,local_264 + 1);
  local_260 = &local_210;
  local_264[0] = FOO;
  DynamicValue::Reader::Reader<capnp::schemas::TestEnum_9c8e9318b29d9cd3,capnp::DynamicEnum>
            (local_260,local_264);
  local_1c8 = &local_258;
  local_1c0._0_8_ = 2;
  value._M_len = 2;
  value._M_array = local_1c8;
  DynamicStruct::Builder::set((Builder *)local_130,(StringPtr)local_1c0._8_16_,value);
  local_388 = (Reader *)&local_1c8;
  do {
    local_388 = local_388 + -1;
    DynamicValue::Reader::~Reader(local_388);
  } while (local_388 != &local_258);
  kj::StringPtr::StringPtr((StringPtr *)auStack_2b8,"enumField");
  DynamicStruct::Builder::get(&local_2a8,(Builder *)local_130,(StringPtr)_auStack_2b8);
  BVar1 = DynamicValue::Builder::as<capnp::schemas::TestEnum_9c8e9318b29d9cd3>(&local_2a8);
  DynamicValue::Builder::~Builder(&local_2a8);
  if (BVar1 != BAZ) {
    local_2b9 = kj::_::Debug::shouldLog(ERROR);
    while (local_2b9 != false) {
      local_2bc = BAZ;
      kj::StringPtr::StringPtr((StringPtr *)&local_310,"enumField");
      DynamicStruct::Builder::get(&local_300,(Builder *)local_130,(StringPtr)local_310);
      local_2be = DynamicValue::Builder::as<capnp::schemas::TestEnum_9c8e9318b29d9cd3>(&local_300);
      kj::_::Debug::
      log<char_const(&)[75],capnp::schemas::TestEnum_9c8e9318b29d9cd3,capnp::schemas::TestEnum_9c8e9318b29d9cd3>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/dynamic-test.c++"
                 ,0x1d0,ERROR,
                 "\"failed: expected \" \"(TestEnum::BAZ) == (root.get(\\\"enumField\\\").as<TestEnum>())\", TestEnum::BAZ, root.get(\"enumField\").as<TestEnum>()"
                 ,(char (*) [75])
                  "failed: expected (TestEnum::BAZ) == (root.get(\"enumField\").as<TestEnum>())",
                 &local_2bc,&local_2be);
      DynamicValue::Builder::~Builder(&local_300);
      local_2b9 = false;
    }
  }
  kj::StringPtr::StringPtr(&local_360,"enumList");
  name.content.size_ = local_360.content.size_;
  name.content.ptr = local_360.content.ptr;
  DynamicStruct::Builder::get(&local_350,(Builder *)local_130,name);
  local_374._0_2_ = VOID;
  local_374._2_2_ = UNKNOWN >> 0x10;
  local_374._4_8_ = local_374;
  local_374._12_8_ = 2;
  expected._M_len = local_360.content.size_;
  expected._M_array = (iterator)0x2;
  (anonymous_namespace)::
  checkList<capnp::schemas::TestEnum_9c8e9318b29d9cd3,capnp::DynamicValue::Builder>
            ((_anonymous_namespace_ *)&local_350,(Builder *)local_374._4_8_,expected);
  DynamicValue::Builder::~Builder(&local_350);
  MallocMessageBuilder::~MallocMessageBuilder((MallocMessageBuilder *)&root.builder.dataSize);
  return;
}

Assistant:

TEST(DynamicApi, SetEnumFromNative) {
  MallocMessageBuilder builder;
  auto root = builder.initRoot<DynamicStruct>(Schema::from<TestAllTypes>());

  root.set("enumField", TestEnum::BAZ);
  root.set("enumList", {TestEnum::BAR, TestEnum::FOO});
  EXPECT_EQ(TestEnum::BAZ, root.get("enumField").as<TestEnum>());
  checkList<TestEnum>(root.get("enumList"), {TestEnum::BAR, TestEnum::FOO});
}